

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdProc.c
# Opt level: O0

void dsdKernelCopyListPlusOneMinusOne
               (Dsd_Node_t *p,Dsd_Node_t *First,Dsd_Node_t **ppList,int nListSize,int iSkipped)

{
  int local_30;
  int local_2c;
  int Counter;
  int i;
  int iSkipped_local;
  int nListSize_local;
  Dsd_Node_t **ppList_local;
  Dsd_Node_t *First_local;
  Dsd_Node_t *p_local;
  
  if (nListSize == p->nDecs) {
    *p->pDecs = First;
    local_30 = 1;
    for (local_2c = 0; local_2c < nListSize; local_2c = local_2c + 1) {
      if (local_2c != iSkipped) {
        p->pDecs[local_30] = ppList[local_2c];
        local_30 = local_30 + 1;
      }
    }
    return;
  }
  __assert_fail("nListSize == p->nDecs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/dsd/dsdProc.c"
                ,0x605,
                "void dsdKernelCopyListPlusOneMinusOne(Dsd_Node_t *, Dsd_Node_t *, Dsd_Node_t **, int, int)"
               );
}

Assistant:

void dsdKernelCopyListPlusOneMinusOne( Dsd_Node_t * p, Dsd_Node_t * First, Dsd_Node_t ** ppList, int nListSize, int iSkipped )
{
    int i, Counter;
    assert( nListSize == p->nDecs );
    p->pDecs[0] = First;
    for( i = 0, Counter = 1; i < nListSize; i++ )
        if ( i != iSkipped )
            p->pDecs[Counter++] = ppList[i];
}